

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O2

int VP8RecordCoeffs(int ctx,VP8Residual *res)

{
  ushort uVar1;
  int16_t *piVar2;
  StatsArray *paapVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  proba_t (*papVar8) [11];
  proba_t *stats;
  byte bVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  
  lVar11 = (long)res->first;
  paapVar3 = res->stats;
  papVar8 = paapVar3[lVar11] + ctx;
  iVar5 = res->last;
  if (iVar5 < 0) {
    iVar5 = 0;
  }
  else {
    for (; iVar10 = (int)lVar11, iVar10 <= iVar5; lVar11 = (ulong)(iVar10 + 1) + lVar11) {
      uVar14 = (*(proba_t (*) [11])*papVar8)[0];
      uVar7 = uVar14 + 1 >> 1 & 0x7fff7fff;
      if (uVar14 < 0xfffe0000) {
        uVar7 = uVar14;
      }
      (*(proba_t (*) [11])*papVar8)[0] = uVar7 + 0x10001;
      lVar12 = (long)iVar10;
      piVar2 = res->coeffs;
      lVar13 = lVar12 << 0x20;
      lVar11 = 0;
      while( true ) {
        lVar13 = lVar13 + 0x100000000;
        uVar14 = (uint)piVar2[lVar12 + lVar11];
        if (piVar2[lVar12 + lVar11] != 0) break;
        uVar14 = (*(proba_t (*) [11])*papVar8)[1];
        uVar7 = uVar14 + 1 >> 1 & 0x7fff7fff;
        if (uVar14 < 0xfffe0000) {
          uVar7 = uVar14;
        }
        (*(proba_t (*) [11])*papVar8)[1] = uVar7 + 0x10000;
        papVar8 = paapVar3[""[lVar11 + lVar12 + 1]];
        lVar11 = lVar11 + 1;
      }
      uVar7 = (*(proba_t (*) [11])*papVar8)[1];
      uVar6 = uVar7 + 1 >> 1 & 0x7fff7fff;
      if (uVar7 < 0xfffe0000) {
        uVar6 = uVar7;
      }
      (*(proba_t (*) [11])*papVar8)[1] = uVar6 + 0x10001;
      VP8RecordStats((uint)(uVar14 - 2 < 0xfffffffd),*(proba_t (*) [11])*papVar8 + 2);
      lVar12 = 1;
      if (uVar14 - 2 < 0xfffffffd) {
        uVar7 = -uVar14;
        if (0 < (int)uVar14) {
          uVar7 = uVar14;
        }
        uVar4 = (ulong)uVar7;
        if (0x42 < uVar7) {
          uVar4 = 0x43;
        }
        uVar1 = *(ushort *)(&DAT_00140dde + uVar4 * 4);
        stats = *(proba_t (*) [11])*papVar8 + 3;
        bVar9 = 0;
        for (uVar14 = (uint)*(ushort *)(&DAT_00140ddc + uVar4 * 4); 1 < uVar14; uVar14 = uVar14 >> 1
            ) {
          if ((uVar14 & 2) != 0) {
            VP8RecordStats((uVar1 >> (bVar9 & 0x1f) & 2) >> 1,stats);
          }
          stats = stats + 1;
          bVar9 = bVar9 + 1;
        }
        lVar12 = 2;
      }
      paapVar3 = res->stats;
      papVar8 = paapVar3[""[lVar13 >> 0x20]] + lVar12;
      iVar5 = res->last;
    }
    iVar5 = 1;
    if (0xf < iVar10) {
      return 1;
    }
  }
  uVar14 = (*(proba_t (*) [11])*papVar8)[0];
  uVar7 = uVar14 + 1 >> 1 & 0x7fff7fff;
  if (uVar14 < 0xfffe0000) {
    uVar7 = uVar14;
  }
  (*(proba_t (*) [11])*papVar8)[0] = uVar7 + 0x10000;
  return iVar5;
}

Assistant:

int VP8RecordCoeffs(int ctx, const VP8Residual* const res) {
  int n = res->first;
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (res->last  < 0) {
    VP8RecordStats(0, s + 0);
    return 0;
  }
  while (n <= res->last) {
    int v;
    VP8RecordStats(1, s + 0);  // order of record doesn't matter
    while ((v = res->coeffs[n++]) == 0) {
      VP8RecordStats(0, s + 1);
      s = res->stats[VP8EncBands[n]][0];
    }
    VP8RecordStats(1, s + 1);
    if (!VP8RecordStats(2u < (unsigned int)(v + 1), s + 2)) {  // v = -1 or 1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      v = abs(v);
#if !defined(USE_LEVEL_CODE_TABLE)
      if (!VP8RecordStats(v > 4, s + 3)) {
        if (VP8RecordStats(v != 2, s + 4))
          VP8RecordStats(v == 4, s + 5);
      } else if (!VP8RecordStats(v > 10, s + 6)) {
        VP8RecordStats(v > 6, s + 7);
      } else if (!VP8RecordStats((v >= 3 + (8 << 2)), s + 8)) {
        VP8RecordStats((v >= 3 + (8 << 1)), s + 9);
      } else {
        VP8RecordStats((v >= 3 + (8 << 3)), s + 10);
      }
#else
      if (v > MAX_VARIABLE_LEVEL) {
        v = MAX_VARIABLE_LEVEL;
      }

      {
        const int bits = VP8LevelCodes[v - 1][1];
        int pattern = VP8LevelCodes[v - 1][0];
        int i;
        for (i = 0; (pattern >>= 1) != 0; ++i) {
          const int mask = 2 << i;
          if (pattern & 1) VP8RecordStats(!!(bits & mask), s + 3 + i);
        }
      }
#endif
      s = res->stats[VP8EncBands[n]][2];
    }
  }
  if (n < 16) VP8RecordStats(0, s + 0);
  return 1;
}